

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int print_reset_indent(BIO **out,int pop_f_prefix,long saved_indent)

{
  BIO *pBVar1;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  BIO *next;
  
  BIO_ctrl((BIO *)*in_RDI,0x50,in_RDX,(void *)0x0);
  if (in_ESI != 0) {
    pBVar1 = BIO_pop((BIO *)*in_RDI);
    BIO_free((BIO *)*in_RDI);
    *in_RDI = pBVar1;
  }
  return 1;
}

Assistant:

static int print_reset_indent(BIO **out, int pop_f_prefix, long saved_indent)
{
    BIO_set_indent(*out, saved_indent);
    if (pop_f_prefix) {
        BIO *next = BIO_pop(*out);

        BIO_free(*out);
        *out = next;
    }
    return 1;
}